

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void aom_dc_predictor_32x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  auVar5 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar6 = vpsadbw_avx2(auVar5,*(undefined1 (*) [32])above);
  auVar2 = vpermq_avx2(auVar6,0x4e);
  auVar2 = vpaddq_avx2(auVar2,auVar6);
  auVar1 = vpshufd_avx2(auVar2,0xee);
  auVar6 = vpsadbw_avx2(auVar5,*(undefined1 (*) [32])left);
  auVar3 = vpermq_avx2(auVar6,0x4e);
  auVar3 = vpaddq_avx2(auVar3,auVar6);
  auVar7._8_2_ = 0x20;
  auVar7._0_8_ = 0x20002000200020;
  auVar7._10_2_ = 0x20;
  auVar7._12_2_ = 0x20;
  auVar7._14_2_ = 0x20;
  auVar7._16_2_ = 0x20;
  auVar7._18_2_ = 0x20;
  auVar7._20_2_ = 0x20;
  auVar7._22_2_ = 0x20;
  auVar7._24_2_ = 0x20;
  auVar7._26_2_ = 0x20;
  auVar7._28_2_ = 0x20;
  auVar7._30_2_ = 0x20;
  auVar6 = vpshufd_avx2(auVar3,0xee);
  auVar6 = vpaddw_avx2(auVar6,auVar7);
  auVar2 = vpaddw_avx2(auVar2,auVar3);
  auVar2 = vpaddw_avx2(auVar2,auVar1);
  auVar6 = vpaddw_avx2(auVar2,auVar6);
  auVar6 = vpsrlw_avx2(auVar6,6);
  auVar6 = vpshufb_avx2(auVar6,auVar5);
  iVar4 = 0x20;
  do {
    *(undefined1 (*) [32])dst = auVar6;
    dst = *(undefined1 (*) [32])dst + stride;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

static inline __m256i dc_sum_32(const uint8_t *ref) {
  const __m256i x = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i zero = _mm256_setzero_si256();
  __m256i y = _mm256_sad_epu8(x, zero);
  __m256i u = _mm256_permute2x128_si256(y, y, 1);
  y = _mm256_add_epi64(u, y);
  u = _mm256_unpackhi_epi64(y, y);
  return _mm256_add_epi16(y, u);
}